

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btRaycastVehicle.cpp
# Opt level: O0

btRigidBody * btActionInterface::getFixedBody(void)

{
  int iVar1;
  btVector3 *unaff_retaddr;
  btScalar in_stack_0000000c;
  btRigidBody *in_stack_00000010;
  btVector3 *in_stack_00000070;
  btCollisionShape *in_stack_00000078;
  btMotionState *in_stack_00000080;
  btScalar in_stack_0000008c;
  btRigidBody *in_stack_00000090;
  btScalar local_48;
  btScalar local_44;
  btScalar local_40;
  btVector3 local_3c [2];
  btScalar local_1c;
  btScalar local_18;
  btScalar local_14;
  btVector3 local_10;
  
  if (getFixedBody()::s_fixed == '\0') {
    iVar1 = __cxa_guard_acquire(&getFixedBody()::s_fixed);
    if (iVar1 != 0) {
      local_14 = 0.0;
      local_18 = 0.0;
      local_1c = 0.0;
      btVector3::btVector3(&local_10,&local_14,&local_18,&local_1c);
      btRigidBody::btRigidBody
                (in_stack_00000090,in_stack_0000008c,in_stack_00000080,in_stack_00000078,
                 in_stack_00000070);
      __cxa_atexit(btRigidBody::~btRigidBody,&getFixedBody::s_fixed,&__dso_handle);
      __cxa_guard_release(&getFixedBody()::s_fixed);
    }
  }
  local_40 = 0.0;
  local_44 = 0.0;
  local_48 = 0.0;
  btVector3::btVector3(local_3c,&local_40,&local_44,&local_48);
  btRigidBody::setMassProps(in_stack_00000010,in_stack_0000000c,unaff_retaddr);
  return &getFixedBody::s_fixed;
}

Assistant:

btRigidBody& btActionInterface::getFixedBody()
{
	static btRigidBody s_fixed(0, 0,0);
	s_fixed.setMassProps(btScalar(0.),btVector3(btScalar(0.),btScalar(0.),btScalar(0.)));
	return s_fixed;
}